

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUpsampleLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  int iVar2;
  bool bVar3;
  UpsampleLayerParams *pUVar4;
  undefined1 local_120 [40];
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_120,layer,1,1);
  Result::operator=(__return_storage_ptr__,(Result *)local_120);
  std::__cxx11::string::~string((string *)(local_120 + 8));
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    validateOutputCount((Result *)local_120,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)local_120);
    std::__cxx11::string::~string((string *)(local_120 + 8));
  }
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string((string *)&local_38,"Upsample",(allocator *)&err);
    validateInputOutputRankEquality((Result *)local_120,layer,&local_38,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_120);
    std::__cxx11::string::~string((string *)(local_120 + 8));
    std::__cxx11::string::~string((string *)&local_38);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&err,"Upsample",(allocator *)&local_d8);
    validateRankCount((Result *)local_120,layer,&err,3,-1,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_120);
    std::__cxx11::string::~string((string *)(local_120 + 8));
    std::__cxx11::string::~string((string *)&err);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
  }
  pUVar4 = Specification::NeuralNetworkLayer::upsample(layer);
  iVar1 = (pUVar4->scalingfactor_).current_size_;
  iVar2 = (pUVar4->fractionalscalingfactor_).current_size_;
  if (iVar1 == 0) {
    if (iVar2 != 0) {
      if (iVar2 == 2) {
        if ((pUVar4->mode_ != 0) && (pUVar4->linearupsamplemode_ != 0)) {
          return __return_storage_ptr__;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,"Invalid upsample layer \'",(layer->name_).ptr_);
        std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_120,
                       "\'. Fractional upsample only compatible with align_corners=true or align_corners=false"
                      );
        std::__cxx11::string::~string((string *)local_120);
        Result::Result((Result *)local_120,INVALID_MODEL_PARAMETERS,&err);
        goto LAB_005915c1;
      }
      goto LAB_005914d3;
    }
  }
  else if (iVar1 != 2 || iVar2 != 0) {
LAB_005914d3:
    std::operator+(&local_78,"Invalid scaling factor in upsampling layer \'",(layer->name_).ptr_);
    std::operator+(&local_58,&local_78,
                   "\'. Only one of scalingFactor and fractionalScalingFactor can be set, and if set, must be of size 2. Found scalingFactor of size "
                  );
    std::__cxx11::to_string(&local_98,(pUVar4->scalingfactor_).current_size_);
    std::operator+(&local_d8,&local_58,&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   &local_d8," and fractionalScalingFactor of size ");
    std::__cxx11::to_string(&local_b8,(pUVar4->fractionalscalingfactor_).current_size_);
    std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_120,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    Result::Result((Result *)local_120,INVALID_MODEL_PARAMETERS,&err);
    goto LAB_005915c1;
  }
  if (pUVar4->linearupsamplemode_ == 0) {
    return __return_storage_ptr__;
  }
  if (pUVar4->mode_ != 0) {
    return __return_storage_ptr__;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 "Layer \'",(layer->name_).ptr_);
  std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120
                 ,
                 "\' of type Upsample uses Nearest Neighbors but uses linear upsampling mode other than DEFAULT."
                );
  std::__cxx11::string::~string((string *)local_120);
  Result::Result((Result *)local_120,INVALID_MODEL_PARAMETERS,&err);
LAB_005915c1:
  Result::operator=(__return_storage_ptr__,(Result *)local_120);
  std::__cxx11::string::~string((string *)(local_120 + 8));
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUpsampleLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Upsample", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Upsample", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.upsample();
    /* If scalingFactor or fractionalScalingFactor are provided, they must be mutually exclusive and of size 2.
                             scalingFactor
                             0 | 2 | Other
                      0      V   V   I
       fractionalSF   2      V   I   I
                      Other  I   I   I
     */
    bool validScalingFactors;
    if (params.scalingfactor_size() == 0) {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 || params.fractionalscalingfactor_size() == 2;
    } else {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 && params.scalingfactor_size() == 2;
    }
    if (!validScalingFactors) {
        std::string err = "Invalid scaling factor in upsampling layer '" + layer.name()
            + "'. Only one of scalingFactor and fractionalScalingFactor can be set, and if set, must be of size 2. Found scalingFactor of size "
            + std::to_string(params.scalingfactor_size()) + " and fractionalScalingFactor of size " + std::to_string(params.fractionalscalingfactor_size());
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (params.fractionalscalingfactor_size() == 2
        && (params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN
            || params.linearupsamplemode() == Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT)) {
        std::string err = "Invalid upsample layer '" + layer.name() + "'. Fractional upsample only compatible with align_corners=true or align_corners=false";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if(params.linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT
       && params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN) {
        std::string err = "Layer '" + layer.name() + "' of type Upsample uses Nearest Neighbors but uses linear upsampling mode other than DEFAULT.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}